

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

void dec_set_mb_mi(CommonModeInfoParams *mi_params,int width,int height,
                  BLOCK_SIZE min_partition_size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = width + 7 >> 2;
  uVar1 = uVar4 & 0xfffffffe;
  mi_params->mi_cols = uVar1;
  uVar2 = height + 7 >> 2;
  mi_params->mi_rows = uVar2 & 0xfffffffe;
  uVar1 = uVar1 + 0x1f & 0xffffffe0;
  mi_params->mi_stride = uVar1;
  iVar5 = (int)(uVar4 + 2) >> 2;
  mi_params->mb_cols = iVar5;
  iVar3 = (int)(uVar2 + 2) >> 2;
  mi_params->mb_rows = iVar3;
  mi_params->MBs = iVar3 * iVar5;
  mi_params->mi_alloc_bsize = BLOCK_4X4;
  mi_params->mi_alloc_stride = uVar1;
  return;
}

Assistant:

static void dec_set_mb_mi(CommonModeInfoParams *mi_params, int width,
                          int height, BLOCK_SIZE min_partition_size) {
  (void)min_partition_size;
  // Ensure that the decoded width and height are both multiples of
  // 8 luma pixels (note: this may only be a multiple of 4 chroma pixels if
  // subsampling is used).
  // This simplifies the implementation of various experiments,
  // eg. cdef, which operates on units of 8x8 luma pixels.
  const int aligned_width = ALIGN_POWER_OF_TWO(width, 3);
  const int aligned_height = ALIGN_POWER_OF_TWO(height, 3);

  mi_params->mi_cols = aligned_width >> MI_SIZE_LOG2;
  mi_params->mi_rows = aligned_height >> MI_SIZE_LOG2;
  mi_params->mi_stride = calc_mi_size(mi_params->mi_cols);

  mi_params->mb_cols = ROUND_POWER_OF_TWO(mi_params->mi_cols, 2);
  mi_params->mb_rows = ROUND_POWER_OF_TWO(mi_params->mi_rows, 2);
  mi_params->MBs = mi_params->mb_rows * mi_params->mb_cols;

  mi_params->mi_alloc_bsize = BLOCK_4X4;
  mi_params->mi_alloc_stride = mi_params->mi_stride;

  assert(mi_size_wide[mi_params->mi_alloc_bsize] ==
         mi_size_high[mi_params->mi_alloc_bsize]);
}